

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

void notify_children(__cilkrts_worker *w,uint msg)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RDI;
  int num_sys_workers;
  __cilkrts_worker *child;
  int child_num;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = *(int *)(*(long *)(in_RDI + 0x30) + 0x528) + -1;
  iVar3 = *(int *)(in_RDI + 0x28) * 2;
  iVar4 = iVar3 + 1;
  if (iVar4 < iVar2) {
    do {
      lVar1 = *(long *)(*(long *)(*(long *)(in_RDI + 0x30) + 0x20) + (long)iVar4 * 8);
    } while (lVar1 == 0);
    if (*(long *)(*(long *)(lVar1 + 0x38) + 0x208) == 0) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0x6c8,"child->l->signal_node");
    }
    signal_node_msg((signal_node_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdc);
    iVar3 = iVar3 + 2;
    if (iVar3 < iVar2) {
      do {
        lVar1 = *(long *)(*(long *)(*(long *)(in_RDI + 0x30) + 0x20) + (long)iVar3 * 8);
      } while (lVar1 == 0);
      if (*(long *)(*(long *)(lVar1 + 0x38) + 0x208) == 0) {
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                      ,0x6cf,"child->l->signal_node");
      }
      signal_node_msg((signal_node_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

static void notify_children(__cilkrts_worker *w, unsigned int msg)
{
    int child_num;
    __cilkrts_worker *child;
    int num_sys_workers = w->g->P - 1;

    // If worker is "n", then its children are 2n + 1, and 2n + 2.
    child_num = (w->self << 1) + 1;
    if (child_num < num_sys_workers) {
        do {
            child = w->g->workers[child_num];
        } while (child == NULL); /* at the begining, busy waiting until the worker is initialized */
        CILK_ASSERT(child->l->signal_node);
        signal_node_msg(child->l->signal_node, msg);
        child_num++;
        if (child_num < num_sys_workers) {
            do {
                child = w->g->workers[child_num];
            } while (child == NULL); /* at the begining, busy waiting until the worker is initialized */
            CILK_ASSERT(child->l->signal_node);
            signal_node_msg(child->l->signal_node, msg);
        }
    }
}